

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.cpp
# Opt level: O2

int mjs::function_object::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  uint32_t *this;
  gc_heap *args;
  uint32_t uVar1;
  void *pvVar2;
  bound_function_args *this_00;
  function_object *pfVar3;
  gc_heap_ptr_untyped *pgVar4;
  long *plVar5;
  long *plVar6;
  int iVar7;
  int named_args;
  undefined4 in_register_0000003c;
  gc_heap_ptr<mjs::function_object> res;
  gc_heap_ptr_untyped local_e8;
  value p;
  gc_heap_ptr<mjs::bound_function_args> bound_args;
  gc_heap_ptr<mjs::global_object> global;
  gc_heap_ptr_untyped local_90;
  gc_heap_ptr_untyped local_80;
  string_view local_70;
  gc_heap_ptr_untyped *local_60;
  
  local_60 = (gc_heap_ptr_untyped *)CONCAT44(in_register_0000003c,__fd);
  args = *(gc_heap **)__addr;
  pvVar2 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)__addr);
  gc_heap_ptr_untracked<mjs::global_object,_true>::track
            ((gc_heap_ptr_untracked<mjs::global_object,_true> *)&global,
             (gc_heap *)((long)pvVar2 + 0x24));
  gc_heap::
  make<mjs::bound_function_args,mjs::gc_heap&,std::vector<mjs::value,std::allocator<mjs::value>>const&>
            ((gc_heap *)&bound_args,args,(vector<mjs::value,_std::allocator<mjs::value>_> *)args);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&p,(gc_heap_ptr_untyped *)__addr);
  this = &p.field_1.o_.super_gc_heap_ptr_untyped.pos_;
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)this,&bound_args.super_gc_heap_ptr_untyped);
  local_70._M_len = 0;
  local_70._M_str = "";
  string::string((string *)&local_e8,args,&local_70);
  pvVar2 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)__addr);
  iVar7 = *(int *)((long)pvVar2 + 0x40);
  this_00 = (bound_function_args *)gc_heap_ptr_untyped::get(&bound_args.super_gc_heap_ptr_untyped);
  uVar1 = bound_function_args::bound_args_len(this_00);
  iVar7 = iVar7 - uVar1;
  named_args = 0;
  if (0 < iVar7) {
    named_args = iVar7;
  }
  make_raw_function((mjs *)&res,&global);
  pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&res.super_gc_heap_ptr_untyped);
  local_90.heap_ = (gc_heap *)0x0;
  local_90.pos_ = 0;
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)&stack0xffffffffffffffa8,
             (size_t)(pfVar3->super_native_object).super_object.heap_);
  pvVar2 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&stack0xffffffffffffffa8);
  *(undefined ***)((long)pvVar2 + 8) = &PTR_destroy_001d7b90;
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)((long)pvVar2 + 0x10),(gc_heap_ptr_untyped *)&p);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)((long)pvVar2 + 0x20),(gc_heap_ptr_untyped *)this);
  put_function(pfVar3,(gc_heap_ptr<mjs::gc_function> *)&stack0xffffffffffffffa8,
               (gc_heap_ptr<mjs::gc_string> *)&local_e8,(gc_heap_ptr<mjs::gc_string> *)&local_90,
               named_args);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffa8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e8);
  bind(mjs::gc_heap_ptr<mjs::function_object>const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)
  ::$_0::~__0((__0 *)&p);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_90,(gc_heap_ptr_untyped *)__addr);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_80,&bound_args.super_gc_heap_ptr_untyped);
  pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&res.super_gc_heap_ptr_untyped);
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)&p,(size_t)(pfVar3->super_native_object).super_object.heap_);
  pvVar2 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&p);
  *(undefined ***)((long)pvVar2 + 8) = &PTR_destroy_001d7bd0;
  gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)((long)pvVar2 + 0x10),&local_90);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)((long)pvVar2 + 0x20),&local_80);
  construct_function(pfVar3,(gc_heap_ptr<mjs::gc_function> *)&p);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&p);
  pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&res.super_gc_heap_ptr_untyped);
  get_prototype(&p,pfVar3);
  if (p.type_ == object) {
    pvVar2 = gc_heap_ptr_untyped::get(&global.super_gc_heap_ptr_untyped);
    if (*(int *)((long)pvVar2 + 0x20) < 1) {
      pgVar4 = &value::object_value(&p)->super_gc_heap_ptr_untyped;
      plVar5 = (long *)gc_heap_ptr_untyped::get(pgVar4);
      plVar6 = (long *)gc_heap_ptr_untyped::get(&global.super_gc_heap_ptr_untyped);
      (**(code **)(*plVar6 + 0x98))(&local_e8,plVar6,"constructor");
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)&local_70,&res.super_gc_heap_ptr_untyped);
      value::value((value *)&stack0xffffffffffffffa8,(object_ptr *)&local_70);
      (**(code **)(*plVar5 + 8))(plVar5,&local_e8,&stack0xffffffffffffffa8,2);
      value::~value((value *)&stack0xffffffffffffffa8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_70);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e8);
    }
    value::~value(&p);
    bind(mjs::gc_heap_ptr<mjs::function_object>const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)
    ::$_1::~__1((__1 *)&local_90);
    pgVar4 = local_60;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(local_60,&res.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&res.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&bound_args.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&global.super_gc_heap_ptr_untyped);
    return (int)pgVar4;
  }
  __assert_fail("p.type() == value_type::object",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.h"
                ,0x59,
                "void mjs::make_constructable(const gc_heap_ptr<global_object> &, gc_heap_ptr<function_object> &, const F &) [F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.cpp:174:37)]"
               );
}

Assistant:

object_ptr function_object::bind(const gc_heap_ptr<function_object>& f, const std::vector<value>& args) {
    auto& h = f.heap();
    auto global = f->global_.track(h);
    auto bound_args = h.make<bound_function_args>(h, args);

    // Actually need to create object to store "args" (thisArg and the extra (needed?) arguments)
    // Put it in a special pointer in function? (will help with the type checks)

    // ES5.1, 15.3.4.5
    auto res = make_function(global, [f, bound_args](const value&, const std::vector<value>& args) {
        return f->call(bound_args->bound_this(), bound_args->build_args(args));
    }, string{h,""}.unsafe_raw_get(), std::max(0,  f->named_args_ - static_cast<int>(bound_args->bound_args_len())));

    make_constructable(global, res, [f, bound_args](const value&, const std::vector<value>& args) {
        return f->construct(value::undefined, bound_args->build_args(args));
    });
    
    return res;
}